

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O0

void Am_Set_Data_From_Object(Am_Object *obj,Am_Inter_Location *data,bool growing)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58 [3];
  undefined1 local_40 [8];
  Am_Value value;
  bool as_line;
  Am_Object ref_obj;
  bool growing_local;
  Am_Inter_Location *data_local;
  Am_Object *obj_local;
  
  ref_obj.data._7_1_ = growing;
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffd8);
  Am_Value::Am_Value((Am_Value *)local_40);
  Am_Object::Get_Owner(local_58,(Am_Slot_Flags)obj);
  Am_Object::operator=((Am_Object *)&stack0xffffffffffffffd8,local_58);
  Am_Object::~Am_Object(local_58);
  pAVar6 = Am_Object::Peek(obj,0xdb,0);
  Am_Value::operator=((Am_Value *)local_40,pAVar6);
  bVar1 = Am_Value::Valid((Am_Value *)local_40);
  if (bVar1) {
    Am_Inter_Location::Get_As_Line(data,(bool *)((long)&value.value + 7));
  }
  else {
    value.value.long_value._7_1_ = 0;
  }
  if ((value.value.long_value._7_1_ & 1) == 0) {
    Am_Object::Am_Object(&local_68,(Am_Object *)&stack0xffffffffffffffd8);
    pAVar6 = Am_Object::Get(obj,100,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(obj,0x65,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(obj,0x66,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(obj,0x67,0);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    Am_Inter_Location::Set_Location(data,false,&local_68,iVar2,iVar3,iVar4,iVar5,false);
    Am_Object::~Am_Object(&local_68);
  }
  else {
    Am_Object::Am_Object(&local_60,(Am_Object *)&stack0xffffffffffffffd8);
    pAVar6 = Am_Object::Get(obj,0x8b,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(obj,0x8c,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(obj,0x8d,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(obj,0x8e,0);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    Am_Inter_Location::Set_Location(data,true,&local_60,iVar2,iVar3,iVar4,iVar5,false);
    Am_Object::~Am_Object(&local_60);
  }
  Am_Inter_Location::Set_Growing(data,(bool)(ref_obj.data._7_1_ & 1),true);
  Am_Value::~Am_Value((Am_Value *)local_40);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void
Am_Set_Data_From_Object(Am_Object obj, Am_Inter_Location data, bool growing)
{
  Am_Object ref_obj;
  bool as_line;
  Am_Value value;
  ref_obj = obj.Get_Owner();
  value = obj.Peek(Am_AS_LINE);
  if (!value.Valid())
    as_line = false;
  else
    data.Get_As_Line(as_line);
  if (as_line) {
    data.Set_Location(true, ref_obj, (int)obj.Get(Am_X1), (int)obj.Get(Am_Y1),
                      (int)obj.Get(Am_X2), (int)obj.Get(Am_Y2), false);
  } else { // not a line growing (lines move like non-lines)
    data.Set_Location(false, ref_obj, (int)obj.Get(Am_LEFT),
                      (int)obj.Get(Am_TOP), (int)obj.Get(Am_WIDTH),
                      (int)obj.Get(Am_HEIGHT), false);
  }
  data.Set_Growing(growing);
}